

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

bool __thiscall flow::lang::Lexer::ipv6HexPart(Lexer *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if (this->currentChar_ == 0x3a) {
    iVar2 = std::istream::peek();
    if (iVar2 != 0x3a) goto LAB_00136fd2;
    std::__cxx11::string::_M_replace
              ((ulong)&this->stringValue_,0,(char *)(this->stringValue_)._M_string_length,0x17192c);
  }
  else {
LAB_00136fd2:
    bVar1 = ipv6HexSeq(this);
    if ((!bVar1) || (this->currentChar_ != 0x3a)) goto LAB_00137044;
    iVar2 = std::istream::peek();
    if (iVar2 != 0x3a) goto LAB_00137044;
    std::__cxx11::string::append((char *)&this->stringValue_);
  }
  nextChar(this,true);
  nextChar(this,true);
  iVar2 = isxdigit(this->currentChar_);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = ipv6HexSeq(this);
  }
LAB_00137044:
  iVar2 = this->currentChar_;
  iVar3 = isalnum(iVar2);
  return (bool)(iVar2 != 0x3a & bVar1 & iVar3 == 0);
}

Assistant:

bool Lexer::ipv6HexPart() {
  bool rv;

  if (currentChar() == ':' && peekChar() == ':') {  // (3)
    stringValue_ = "::";
    nextChar();  // skip ':'
    nextChar();  // skip ':'
    rv = isHexChar() ? ipv6HexSeq() : true;
  } else if (!!(rv = ipv6HexSeq())) {
    if (currentChar() == ':' && peekChar() == ':') {  // (2)
      stringValue_ += "::";
      nextChar();  // skip ':'
      nextChar();  // skip ':'
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  }

  if (std::isalnum(currentChar_) || currentChar_ == ':') rv = false;

  return rv;
}